

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int vcf_write_line(htsFile *fp,kstring_t *line)

{
  int iVar1;
  ssize_t sVar2;
  int local_1c;
  int ret;
  kstring_t *line_local;
  htsFile *fp_local;
  
  if (line->s[line->l - 1] != '\n') {
    kputc(10,line);
  }
  if ((fp->format).compression == no_compression) {
    sVar2 = hwrite((fp->fp).hfile,line->s,line->l);
    local_1c = (int)sVar2;
  }
  else {
    sVar2 = bgzf_write((fp->fp).bgzf,line->s,line->l);
    local_1c = (int)sVar2;
  }
  iVar1 = -1;
  if ((long)local_1c == line->l) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int vcf_write_line(htsFile *fp, kstring_t *line)
{
    int ret;
    if ( line->s[line->l-1]!='\n' ) kputc('\n',line);
    if ( fp->format.compression!=no_compression )
        ret = bgzf_write(fp->fp.bgzf, line->s, line->l);
    else
        ret = hwrite(fp->fp.hfile, line->s, line->l);
    return ret==line->l ? 0 : -1;
}